

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_189743::CBSTest_ASN1Uint64_Test::TestBody(CBSTest_ASN1Uint64_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *message;
  CBS_ASN1_TAG tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer value_00;
  anon_union_32_2_4f6aaa2e_for_u *paVar2;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar3;
  bool bVar4;
  int iVar5;
  anon_union_32_2_4f6aaa2e_for_u *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long lVar8;
  ScopedTrace *this_00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var9;
  char *pcVar10;
  char *in_R9;
  ScopedTrace gtest_trace_936;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  ScopedTrace gtest_trace_937;
  ScopedCBB cbb;
  UniquePtr<uint8_t> scoper;
  int is_negative;
  CBS cbs;
  size_t len;
  CBS child;
  uint8_t *out;
  UniquePtr<uint8_t> scoper_1;
  uint64_t value;
  ScopedTrace local_119;
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined1 local_f8 [24];
  Bytes local_e0;
  undefined1 local_d0 [16];
  anon_union_32_2_4f6aaa2e_for_u local_c0;
  Bytes local_a0;
  ScopedTrace local_8c [4];
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_78;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  CBS local_68;
  _Head_base<0UL,_unsigned_char_*,_false> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_48;
  _Head_base<0UL,_unsigned_char_*,_false> local_40;
  unsigned_long *local_38;
  
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    message = pbVar7 + 0x3664a;
    paVar6 = (anon_union_32_2_4f6aaa2e_for_u *)pbVar7[0x3664a]._M_string_length;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pbVar7[0x3664a].field_2._M_allocated_capacity;
    local_d0._0_8_ = paVar6;
    local_d0._8_8_ = pbVar1;
    local_50 = pbVar7;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_119,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x3a8,(Bytes *)local_d0);
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              ((ScopedTrace *)(local_f8 + 0x17),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x3a9,(unsigned_long *)message);
    local_88 = (undefined1  [8])paVar6;
    local_80 = pbVar1;
    iVar5 = CBS_get_asn1_uint64((CBS *)local_88,(uint64_t *)&local_40);
    local_108[0] = (internal)(iVar5 != 0);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_108,
                 (AssertionResult *)"CBS_get_asn1_uint64(&cbs, &value)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3b0,(char *)local_d0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d0._0_8_ != &local_c0) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_c0.base.buf + 1));
      }
      _Var9._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(local_68.data._4_4_,local_68.data._0_4_);
LAB_0021962e:
      if ((anon_union_32_2_4f6aaa2e_for_u *)_Var9._M_head_impl !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)_Var9._M_head_impl + 8))();
      }
      if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_100,local_100);
      }
LAB_002197dd:
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)(local_f8 + 0x17));
      this_00 = &local_119;
      goto LAB_002197ec;
    }
    local_68.data._0_4_ = 0;
    local_108 = (undefined1  [8])local_80;
    local_70._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )paVar6;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_d0,"0u","CBS_len(&cbs)",(uint *)&local_68,
               (unsigned_long *)local_108);
    if (local_d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_108);
      pcVar10 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = ((_Alloc_hider *)local_d0._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3b1,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_108 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d0._8_8_);
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_d0,"test.value","value",(unsigned_long *)message,
               (unsigned_long *)&local_40);
    if (local_d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_108);
      pcVar10 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = ((_Alloc_hider *)local_d0._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3b2,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_108 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d0._8_8_);
    }
    local_88 = (undefined1  [8])
               local_70._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    local_80 = pbVar1;
    iVar5 = CBS_get_asn1((CBS *)local_88,&local_68,2);
    local_108[0] = (internal)(iVar5 != 0);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)local_118);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_108,
                 (AssertionResult *)"CBS_get_asn1(&cbs, &child, 0x2u)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3b7,(char *)local_d0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
      _Var9._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d0._0_8_ != &local_c0) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_c0.base.buf + 1));
        _Var9._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
      }
      goto LAB_0021962e;
    }
    iVar5 = CBS_is_valid_asn1_integer(&local_68,(int *)local_8c);
    local_108[0] = (internal)(iVar5 != 0);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)local_118);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_108,
                 (AssertionResult *)"CBS_is_valid_asn1_integer(&child, &is_negative)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3b8,(char *)local_d0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d0._0_8_ != &local_c0) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_c0.base.buf + 1));
      }
      if (local_118 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_118 + 8))();
      }
      if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_100,local_100);
      }
    }
    local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_d0,"0","is_negative",(int *)local_108,(int *)local_8c);
    if (local_d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_108);
      pcVar10 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = ((_Alloc_hider *)local_d0._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3b9,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
      if (local_108 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d0._8_8_);
    }
    iVar5 = CBS_is_unsigned_asn1_integer(&local_68);
    local_108[0] = (internal)(iVar5 != 0);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)local_118);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_108,(AssertionResult *)0x51b0ff,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3ba,(char *)local_d0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d0._0_8_ != &local_c0) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_c0.base.buf + 1));
      }
      if (local_118 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_118 + 8))();
      }
      if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_100,local_100);
      }
    }
    CBB_zero((CBB *)local_d0);
    iVar5 = CBB_init((CBB *)local_d0,0);
    local_118[0] = (internal)(iVar5 != 0);
    local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_108,(internal *)local_118,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3be,(char *)local_108);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_e0);
LAB_00219786:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,(ulong)(local_f8._0_8_ + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_e0.span_.data_ !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_e0.span_.data_ + 8))();
      }
      if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_110,local_110);
      }
      CBB_cleanup((CBB *)local_d0);
      goto LAB_002197dd;
    }
    value_00 = (message->_M_dataplus)._M_p;
    iVar5 = CBB_add_asn1_uint64((CBB *)local_d0,(uint64_t)value_00);
    local_118[0] = (internal)(iVar5 != 0);
    local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_108,(internal *)local_118,
                 (AssertionResult *)"CBB_add_asn1_uint64(cbb.get(), test.value)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3bf,(char *)local_108);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_e0);
      goto LAB_00219786;
    }
    iVar5 = CBB_finish((CBB *)local_d0,&local_58._M_head_impl,(size_t *)&local_78);
    local_118[0] = (internal)(iVar5 != 0);
    local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_108,(internal *)local_118,
                 (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3c0,(char *)local_108);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_e0);
      goto LAB_00219786;
    }
    local_a0.span_.data_ = local_58._M_head_impl;
    local_118 = (undefined1  [8])
                local_70._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    local_e0.span_.data_ = local_58._M_head_impl;
    local_e0.span_.size_ =
         (size_t)local_78._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    local_110 = pbVar1;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_108,"Bytes(test.encoding, test.encoding_len)","Bytes(out, len)",
               (Bytes *)local_118,&local_e0);
    if (local_108[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_118);
      pcVar10 = "";
      if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = (local_100->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3c2,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
      if (local_118 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_118 + 8))();
      }
    }
    if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,local_100);
    }
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_a0);
    CBB_cleanup((CBB *)local_d0);
    CBB_zero((CBB *)local_d0);
    iVar5 = CBB_init((CBB *)local_d0,0);
    local_118[0] = (internal)(iVar5 != 0);
    local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_108,(internal *)local_118,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3c8,(char *)local_108);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_e0);
LAB_00218a85:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,(ulong)(local_f8._0_8_ + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_e0.span_.data_ !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_e0.span_.data_ + 8))();
      }
      if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_110,local_110);
      }
      bVar4 = false;
    }
    else {
      iVar5 = CBB_add_asn1_uint64_with_tag((CBB *)local_d0,(uint64_t)value_00,0x80000001);
      local_118[0] = (internal)(iVar5 != 0);
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar5 == 0) {
        testing::Message::Message((Message *)&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_108,(internal *)local_118,
                   (AssertionResult *)
                   "CBB_add_asn1_uint64_with_tag(cbb.get(), test.value, (0x80u << 24) | 1)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3ca,(char *)local_108);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_e0);
        goto LAB_00218a85;
      }
      iVar5 = CBB_finish((CBB *)local_d0,&local_58._M_head_impl,(size_t *)&local_78);
      local_118[0] = (internal)(iVar5 != 0);
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar5 == 0) {
        testing::Message::Message((Message *)&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_108,(internal *)local_118,
                   (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3cb,(char *)local_108);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_e0);
        goto LAB_00218a85;
      }
      local_48._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           local_58._M_head_impl;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_108,
                 (char *)local_70._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,
                 (char *)((long)(uint8_t **)
                                local_70._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + (long)&pbVar1->_M_dataplus),
                 (allocator_type *)local_118);
      *(char *)local_108 = -0x7f;
      local_e0.span_.size_ = (long)local_100 - (long)local_108;
      local_e0.span_.data_ = (uchar *)local_108;
      local_a0.span_.data_ = local_58._M_head_impl;
      local_a0.span_.size_ =
           (size_t)local_78._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_118,"Bytes(expected)","Bytes(out, len)",&local_e0,&local_a0);
      if (local_118[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_e0);
        pcVar10 = "";
        if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = (local_110->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3d0,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
        if ((anon_union_32_2_4f6aaa2e_for_u *)local_e0.span_.data_ !=
            (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
          (**(code **)(*(long *)local_e0.span_.data_ + 8))();
        }
      }
      if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_110,local_110);
      }
      if (local_108 != (undefined1  [8])0x0) {
        operator_delete((void *)local_108,local_f8._0_8_ - (long)local_108);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_48);
      bVar4 = true;
    }
    CBB_cleanup((CBB *)local_d0);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)(local_f8 + 0x17));
    testing::ScopedTrace::~ScopedTrace(&local_119);
    if (!bVar4) {
      return;
    }
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&local_50->field_2 + 8);
  } while (pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa8);
  paVar6 = (anon_union_32_2_4f6aaa2e_for_u *)&DAT_006cca00;
  lVar8 = 0x78;
  do {
    paVar2 = *(anon_union_32_2_4f6aaa2e_for_u **)((long)paVar6 + -0x10);
    pbVar7 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((long)paVar6 + -8);
    local_d0._0_8_ = paVar2;
    local_d0._8_8_ = pbVar7;
    local_70._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )paVar6;
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x3d5,(Bytes *)local_d0);
    local_108 = (undefined1  [8])paVar2;
    local_100 = pbVar7;
    iVar5 = CBS_get_asn1_uint64((CBS *)local_108,(uint64_t *)&local_68);
    local_88[0] = (internal)(iVar5 == 0);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 != 0) {
      testing::Message::Message((Message *)local_118);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_88,
                 (AssertionResult *)"CBS_get_asn1_uint64(&cbs, &value)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3da,(char *)local_d0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d0._0_8_ != &local_c0) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_c0.base.buf + 1));
      }
      if (local_118 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_118 + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    local_108 = (undefined1  [8])paVar2;
    local_100 = pbVar7;
    iVar5 = CBS_get_asn1((CBS *)local_108,(CBS *)local_d0,2);
    if (iVar5 != 0) {
      iVar5 = CBS_is_unsigned_asn1_integer((CBS *)local_d0);
      local_118[0] = (internal)(iVar5 != 0);
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)local_88,"test.overflow","!!CBS_is_unsigned_asn1_integer(&child)",
                 (bool *)local_70._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,(bool *)local_118);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_118);
        pcVar10 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3df,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_118);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
        if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )local_118 !=
            (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )0x0) {
          (**(code **)(*(long *)local_118 + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_a0);
    paVar6 = (anon_union_32_2_4f6aaa2e_for_u *)
             ((long)local_70._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x18);
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != 0);
  paVar6 = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
  do {
    uVar3._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )paVar6[0x36654].base.buf;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             paVar6[0x36654].base.len;
    local_d0._0_8_ =
         uVar3._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    local_d0._8_8_ = pbVar7;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (local_8c,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x3e4,(Bytes *)local_d0);
    local_38 = (unsigned_long *)(&DAT_006cca78 + (long)paVar6);
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              (&local_119,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x3e5,(unsigned_long *)(&DAT_006cca78 + (long)paVar6));
    tag = *(CBS_ASN1_TAG *)((long)&(anonymous_namespace)::kASN1Uint64WithTagTests + (long)paVar6);
    local_88 = (undefined1  [8])
               uVar3._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    local_80 = pbVar7;
    local_70._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )paVar6;
    local_50 = pbVar7;
    iVar5 = CBS_get_asn1_uint64_with_tag((CBS *)local_88,(uint64_t *)&local_a0,tag);
    local_108[0] = (internal)(iVar5 != 0);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_108,
                 (AssertionResult *)"CBS_get_asn1_uint64_with_tag(&cbs, &value, test.tag)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3ec,(char *)local_d0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d0._0_8_ != &local_c0) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_c0.base.buf + 1));
      }
      _Var9._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(local_68.data._4_4_,local_68.data._0_4_);
LAB_00219921:
      if ((anon_union_32_2_4f6aaa2e_for_u *)_Var9._M_head_impl !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)_Var9._M_head_impl + 8))();
      }
      if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_100,local_100);
      }
      testing::ScopedTrace::~ScopedTrace(&local_119);
      this_00 = local_8c;
LAB_002197ec:
      testing::ScopedTrace::~ScopedTrace(this_00);
      return;
    }
    local_68.data._0_4_ = 0;
    local_108 = (undefined1  [8])local_80;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_d0,"0u","CBS_len(&cbs)",(uint *)&local_68,
               (unsigned_long *)local_108);
    if (local_d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_108);
      pcVar10 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = ((_Alloc_hider *)local_d0._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3ed,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_108 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d0._8_8_);
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_d0,"test.value","value",local_38,(unsigned_long *)&local_a0);
    if (local_d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_108);
      pcVar10 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = ((_Alloc_hider *)local_d0._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3ee,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_108 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d0._8_8_);
    }
    local_80 = local_50;
    local_88 = (undefined1  [8])
               uVar3._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    iVar5 = CBS_get_asn1((CBS *)local_88,&local_68,tag);
    local_108[0] = (internal)(iVar5 != 0);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)local_118);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_108,
                 (AssertionResult *)"CBS_get_asn1(&cbs, &child, test.tag)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3f3,(char *)local_d0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
      _Var9._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d0._0_8_ != &local_c0) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_c0.base.buf + 1));
        _Var9._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
      }
      goto LAB_00219921;
    }
    iVar5 = CBS_is_valid_asn1_integer(&local_68,(int *)&local_48);
    local_108[0] = (internal)(iVar5 != 0);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)local_118);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_108,
                 (AssertionResult *)"CBS_is_valid_asn1_integer(&child, &is_negative)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3f4,(char *)local_d0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d0._0_8_ != &local_c0) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_c0.base.buf + 1));
      }
      if (local_118 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_118 + 8))();
      }
      if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_100,local_100);
      }
    }
    local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_d0,"0","is_negative",(int *)local_108,(int *)&local_48);
    if (local_d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_108);
      pcVar10 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = ((_Alloc_hider *)local_d0._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3f5,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
      if (local_108 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d0._8_8_);
    }
    iVar5 = CBS_is_unsigned_asn1_integer(&local_68);
    local_108[0] = (internal)(iVar5 != 0);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)local_118);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_108,(AssertionResult *)0x51b0ff,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3f6,(char *)local_d0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d0._0_8_ != &local_c0) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_c0.base.buf + 1));
      }
      if (local_118 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_118 + 8))();
      }
      if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_100,local_100);
      }
    }
    CBB_zero((CBB *)local_d0);
    iVar5 = CBB_init((CBB *)local_d0,0);
    local_118[0] = (internal)(iVar5 != 0);
    local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_108,(internal *)local_118,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x3fa,(char *)local_108);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_e0);
LAB_00219477:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,(ulong)(local_f8._0_8_ + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_e0.span_.data_ !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_e0.span_.data_ + 8))();
      }
      if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_110,local_110);
      }
      bVar4 = true;
    }
    else {
      iVar5 = CBB_add_asn1_uint64_with_tag
                        ((CBB *)local_d0,
                         *(uint64_t *)
                          (&DAT_006cca78 +
                          (long)local_70._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl),tag);
      local_118[0] = (internal)(iVar5 != 0);
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar5 == 0) {
        testing::Message::Message((Message *)&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_108,(internal *)local_118,
                   (AssertionResult *)
                   "CBB_add_asn1_uint64_with_tag(cbb.get(), test.value, test.tag)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3fb,(char *)local_108);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_e0);
        goto LAB_00219477;
      }
      iVar5 = CBB_finish((CBB *)local_d0,&local_40._M_head_impl,(size_t *)&local_58);
      local_118[0] = (internal)(iVar5 != 0);
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar5 == 0) {
        testing::Message::Message((Message *)&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_108,(internal *)local_118,
                   (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3fc,(char *)local_108);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_e0);
        goto LAB_00219477;
      }
      local_78._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           local_40._M_head_impl;
      local_110 = local_50;
      local_e0.span_.data_ = local_40._M_head_impl;
      local_e0.span_.size_ = (size_t)local_58._M_head_impl;
      local_118 = (undefined1  [8])
                  uVar3._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_108,"Bytes(test.encoding, test.encoding_len)","Bytes(out, len)",
                 (Bytes *)local_118,&local_e0);
      if (local_108[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_118);
        pcVar10 = "";
        if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = (local_100->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x3fe,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_118);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
        if (local_118 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_118 + 8))();
        }
      }
      if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_100,local_100);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_78);
      bVar4 = false;
    }
    CBB_cleanup((CBB *)local_d0);
    testing::ScopedTrace::~ScopedTrace(&local_119);
    testing::ScopedTrace::~ScopedTrace(local_8c);
    paVar6 = (anon_union_32_2_4f6aaa2e_for_u *)
             ((long)local_70._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x20);
    if (bVar4 || local_70._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl ==
                 (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )&DAT_000000a0) {
      return;
    }
  } while( true );
}

Assistant:

TEST(CBSTest, ASN1Uint64) {
  for (const ASN1Uint64Test &test : kASN1Uint64Tests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    SCOPED_TRACE(test.value);
    CBS cbs;
    uint64_t value;
    uint8_t *out;
    size_t len;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1_uint64(&cbs, &value));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_EQ(test.value, value);

    CBS child;
    int is_negative;
    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1(&cbs, &child, CBS_ASN1_INTEGER));
    EXPECT_TRUE(CBS_is_valid_asn1_integer(&child, &is_negative));
    EXPECT_EQ(0, is_negative);
    EXPECT_TRUE(CBS_is_unsigned_asn1_integer(&child));

    {
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_uint64(cbb.get(), test.value));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      EXPECT_EQ(Bytes(test.encoding, test.encoding_len), Bytes(out, len));
    }

    {
      // Overwrite the tag.
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_uint64_with_tag(cbb.get(), test.value,
                                               CBS_ASN1_CONTEXT_SPECIFIC | 1));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      std::vector<uint8_t> expected(test.encoding,
                                    test.encoding + test.encoding_len);
      expected[0] = 0x81;
      EXPECT_EQ(Bytes(expected), Bytes(out, len));
    }
  }

  for (const ASN1InvalidUint64Test &test : kASN1InvalidUint64Tests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    CBS cbs;
    uint64_t value;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    EXPECT_FALSE(CBS_get_asn1_uint64(&cbs, &value));

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    CBS child;
    if (CBS_get_asn1(&cbs, &child, CBS_ASN1_INTEGER)) {
      EXPECT_EQ(test.overflow, !!CBS_is_unsigned_asn1_integer(&child));
    }
  }

  for (const ASN1Uint64WithTagTest &test : kASN1Uint64WithTagTests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    SCOPED_TRACE(test.value);
    CBS cbs;
    uint64_t value;
    uint8_t *out;
    size_t len;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1_uint64_with_tag(&cbs, &value, test.tag));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_EQ(test.value, value);

    CBS child;
    int is_negative;
    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1(&cbs, &child, test.tag));
    EXPECT_TRUE(CBS_is_valid_asn1_integer(&child, &is_negative));
    EXPECT_EQ(0, is_negative);
    EXPECT_TRUE(CBS_is_unsigned_asn1_integer(&child));

    {
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_uint64_with_tag(cbb.get(), test.value, test.tag));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      EXPECT_EQ(Bytes(test.encoding, test.encoding_len), Bytes(out, len));
    }
  }
}